

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O3

psa_status_t
psa_parse_key_data_from_storage
          (uint8_t *storage_data,size_t storage_data_length,uint8_t **key_data,
          size_t *key_data_length,psa_core_key_attributes_t *attr)

{
  uint8_t *__dest;
  psa_status_t pVar1;
  ulong __size;
  
  pVar1 = -0x92;
  if (((0x23 < storage_data_length) && (*(long *)storage_data == 0x59454b00415350)) &&
     (*(int *)(storage_data + 8) == 0)) {
    __size = (ulong)*(uint *)(storage_data + 0x20);
    *key_data_length = __size;
    if (__size < 0x2000 && __size <= storage_data_length - 0x24) {
      if (__size == 0) {
        *key_data = (uint8_t *)0x0;
      }
      else {
        __dest = (uint8_t *)calloc(1,__size);
        *key_data = __dest;
        if (__dest == (uint8_t *)0x0) {
          return -0x8d;
        }
        memcpy(__dest,storage_data + 0x24,__size);
      }
      attr->lifetime = *(psa_key_lifetime_t *)(storage_data + 0xc);
      if (*(short *)(storage_data + 0x12) == 0) {
        attr->type = *(psa_key_type_t *)(storage_data + 0x10);
        (attr->policy).usage = *(psa_key_usage_t *)(storage_data + 0x14);
        (attr->policy).alg = *(psa_algorithm_t *)(storage_data + 0x18);
        (attr->policy).alg2 = *(psa_algorithm_t *)(storage_data + 0x1c);
        pVar1 = 0;
      }
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_parse_key_data_from_storage( const uint8_t *storage_data,
                                              size_t storage_data_length,
                                              uint8_t **key_data,
                                              size_t *key_data_length,
                                              psa_core_key_attributes_t *attr )
{
    psa_status_t status;
    const psa_persistent_key_storage_format *storage_format =
        (const psa_persistent_key_storage_format *)storage_data;
    uint32_t version;
    uint32_t type;

    if( storage_data_length < sizeof(*storage_format) )
        return( PSA_ERROR_STORAGE_FAILURE );

    status = check_magic_header( storage_data );
    if( status != PSA_SUCCESS )
        return( status );

    GET_UINT32_LE( version, storage_format->version, 0 );
    if( version != 0 )
        return( PSA_ERROR_STORAGE_FAILURE );

    GET_UINT32_LE( *key_data_length, storage_format->data_len, 0 );
    if( *key_data_length > ( storage_data_length - sizeof(*storage_format) ) ||
        *key_data_length > PSA_CRYPTO_MAX_STORAGE_SIZE )
        return( PSA_ERROR_STORAGE_FAILURE );

    if( *key_data_length == 0 )
    {
        *key_data = NULL;
    }
    else
    {
        *key_data = mbedtls_calloc( 1, *key_data_length );
        if( *key_data == NULL )
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        memcpy( *key_data, storage_format->key_data, *key_data_length );
    }

    GET_UINT32_LE( attr->lifetime, storage_format->lifetime, 0 );
    GET_UINT32_LE( type, storage_format->type, 0 );
    if( type <= (psa_key_type_t) -1 )
        attr->type = (psa_key_type_t) type;
    else
        return( PSA_ERROR_STORAGE_FAILURE );
    GET_UINT32_LE( attr->policy.usage, storage_format->policy, 0 );
    GET_UINT32_LE( attr->policy.alg, storage_format->policy, sizeof( uint32_t ) );
    GET_UINT32_LE( attr->policy.alg2, storage_format->policy, 2 * sizeof( uint32_t ) );

    return( PSA_SUCCESS );
}